

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O1

Index __thiscall
SimulationDecPOMDPDiscrete::GetAction
          (SimulationDecPOMDPDiscrete *this,
          vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
          *agents,Index i,Index jaI,Index joI,double r,Index prevJoI,Index sI,Index prevJaI,
          double *specialR)

{
  long *plVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  Index IVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if (joI == 0x7fffffff) {
    plVar1 = *(long **)(*(long *)agents + (ulong)i * 8);
    IVar3 = (**(code **)(*plVar1 + 0x40))(plVar1,0x7fffffff,prevJoI);
    return IVar3;
  }
  pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
  __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        (**(code **)((long)*pMVar2 + 0xe8))
                  (pMVar2,joI,CONCAT44(in_register_00000014,i),CONCAT44(in_register_0000000c,jaI));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,__x);
  plVar1 = *(long **)(*(long *)agents + (ulong)i * 8);
  IVar3 = (**(code **)(*plVar1 + 0x40))
                    (plVar1,local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[i],prevJoI);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar3;
}

Assistant:

Index SimulationDecPOMDPDiscrete::
GetAction(const vector<AgentDelayedSharedObservations*> &agents,
          Index i, Index jaI, Index joI, double r, Index prevJoI,
          Index sI, Index prevJaI, double &specialR) const
{
    if(joI==INT_MAX) //first stage: there is no joI
        return(agents[i]->Act(INT_MAX,prevJoI));
    else
    {
        vector<Index> oIs=_m_pu->JointToIndividualObservationIndices(joI);
        return(agents[i]->Act(oIs[i],prevJoI));
    }
}